

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void reset_frame_buffers(AV1_COMMON *cm)

{
  long in_RDI;
  int i;
  RefCntBuffer *frame_bufs;
  int local_14;
  AV1_COMMON *cm_00;
  
  cm_00 = *(AV1_COMMON **)(*(long *)(in_RDI + 0x62f0) + 0x40);
  lock_buffer_pool((BufferPool *)0x1ac2ff);
  reset_ref_frame_map(cm_00);
  for (local_14 = 0; local_14 < (int)(uint)*(byte *)(*(long *)(in_RDI + 0x62f0) + 0x48);
      local_14 = local_14 + 1) {
    if (((int)cm_00->buffer_removal_times[(long)local_14 * 0x1638 + -0x15] < 1) ||
       (cm_00->buffer_removal_times + (long)local_14 * 0x1638 + -0x15 ==
        (uint32_t *)*(undefined1 **)(in_RDI + 0xe8))) {
      cm_00->buffer_removal_times[(long)local_14 * 0x1638 + -0x14] = 0;
      memset(cm_00->buffer_removal_times + (long)local_14 * 0x1638 + -0x13,0,0x1c);
    }
  }
  av1_zero_unused_internal_frame_buffers((InternalFrameBufferList *)cm_00);
  unlock_buffer_pool((BufferPool *)0x1ac3df);
  return;
}

Assistant:

static inline void reset_frame_buffers(AV1_COMMON *cm) {
  RefCntBuffer *const frame_bufs = cm->buffer_pool->frame_bufs;
  int i;

  lock_buffer_pool(cm->buffer_pool);
  reset_ref_frame_map(cm);
  assert(cm->cur_frame->ref_count == 1);
  for (i = 0; i < cm->buffer_pool->num_frame_bufs; ++i) {
    // Reset all unreferenced frame buffers. We can also reset cm->cur_frame
    // because we are the sole owner of cm->cur_frame.
    if (frame_bufs[i].ref_count > 0 && &frame_bufs[i] != cm->cur_frame) {
      continue;
    }
    frame_bufs[i].order_hint = 0;
    av1_zero(frame_bufs[i].ref_order_hints);
  }
  av1_zero_unused_internal_frame_buffers(&cm->buffer_pool->int_frame_buffers);
  unlock_buffer_pool(cm->buffer_pool);
}